

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall
cmCTestSubmitCommand::InitializeHandler(cmCTestSubmitCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  cmCTestSubmitHandler *pcVar3;
  bool bVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ostream *poVar7;
  string *psVar8;
  container_type *pcVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  iterator __first;
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *range;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c98;
  string *local_c30;
  allocator<char> local_a49;
  string local_a48;
  allocator<char> local_a21;
  string local_a20;
  allocator<char> local_9f9;
  string local_9f8;
  allocator<char> local_9d1;
  string local_9d0;
  allocator<char> local_9a9;
  string local_9a8;
  allocator<char> local_981;
  string local_980;
  TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_CTest_cmCTestSubmitCommand_cxx:148:45)>
  local_960;
  TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_CTest_cmCTestSubmitCommand_cxx:148:45)>
  local_950;
  set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_> local_940;
  cmCTestSubmitCommand *local_910;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_908;
  undefined1 local_8f8 [8];
  cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_CTest_cmCTestSubmitCommand_cxx:148:45)>_>
  parts;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8c8;
  set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_> local_898;
  cmCTestSubmitHandler *local_868;
  cmCTestSubmitHandler *handler;
  string local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  iterator local_810;
  size_type local_808;
  undefined1 local_800 [8];
  cmList extraFiles;
  string local_7e0;
  cmValue local_7c0;
  cmValue extraFilesVariable;
  string local_7b0;
  iterator local_790;
  size_type local_788;
  undefined1 local_780 [8];
  cmList notesFiles;
  string local_760;
  cmValue local_740;
  cmValue notesFilesVariable;
  string local_730;
  allocator<char> local_709;
  string local_708;
  string local_6e8 [32];
  ostringstream local_6c8 [8];
  ostringstream cmCTestLog_msg_2;
  allocator<char> local_549;
  string local_548;
  cmValue local_528;
  cmValue tlsVerifyVar;
  string local_518;
  string local_4f8 [32];
  undefined1 local_4d8 [8];
  ostringstream cmCTestLog_msg_1;
  allocator<char> local_359;
  string local_358;
  undefined1 local_338 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tlsVersionEnv;
  ostringstream local_2f0 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_171;
  string local_170;
  cmValue local_150;
  cmValue tlsVersionVar;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  byte local_55;
  byte local_42;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue submitURL;
  cmCTestSubmitCommand *this_local;
  
  submitURL.Value = (string *)this;
  uVar5 = std::__cxx11::string::empty();
  local_42 = 0;
  local_55 = 0;
  if ((uVar5 & 1) == 0) {
    cmValue::cmValue(&local_20,&this->SubmitURL);
  }
  else {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"CTEST_SUBMIT_URL",&local_41);
    local_55 = 1;
    local_20 = cmMakefile::GetDefinition(pcVar1,&local_40);
  }
  if ((local_55 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator(&local_41);
  }
  bVar4 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar4) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    psVar8 = cmValue::operator*[abi_cxx11_(&local_20);
    cmCTest::SetCTestConfiguration
              (pcVar2,"SubmitURL",psVar8,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  else {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CTEST_DROP_METHOD",&local_79);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar2,pcVar1,"DropMethod",&local_78,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"CTEST_DROP_SITE_USER",&local_a1);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar2,pcVar1,"DropSiteUser",&local_a0,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"CTEST_DROP_SITE_PASSWORD",&local_c9);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar2,pcVar1,"DropSitePassword",&local_c8,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"CTEST_DROP_SITE",&local_f1);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar2,pcVar1,"DropSite",&local_f0,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CTEST_DROP_LOCATION",&local_119);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar2,pcVar1,"DropLocation",&local_118,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"CTEST_TLS_VERSION",
             (allocator<char> *)((long)&tlsVersionVar.Value + 7));
  bVar4 = cmCTest::SetCTestConfigurationFromCMakeVariable
                    (pcVar2,pcVar1,"TLSVersion",&local_140,
                     (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tlsVersionVar.Value + 7));
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"CMAKE_TLS_VERSION",&local_171);
    local_150 = cmMakefile::GetDefinition(pcVar1,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    bVar4 = cmValue::operator_cast_to_bool(&local_150);
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream(local_2f0);
      poVar7 = std::operator<<((ostream *)local_2f0,
                               "SetCTestConfiguration from CMAKE_TLS_VERSION:TLSVersion:");
      psVar8 = cmValue::operator*[abi_cxx11_(&local_150);
      poVar7 = std::operator<<(poVar7,(string *)psVar8);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::ostringstream::str();
      pcVar11 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitCommand.cxx"
                   ,0x42,pcVar11,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
      std::__cxx11::string::~string
                ((string *)
                 &tlsVersionEnv.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged);
      std::__cxx11::ostringstream::~ostringstream(local_2f0);
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      psVar8 = cmValue::operator*[abi_cxx11_(&local_150);
      cmCTest::SetCTestConfiguration
                (pcVar2,"TLSVersion",psVar8,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,"CMAKE_TLS_VERSION",&local_359);
      cmSystemTools::GetEnvVar
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_338,&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      std::allocator<char>::~allocator(&local_359);
      bVar4 = std::optional::operator_cast_to_bool((optional *)local_338);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d8);
        poVar7 = std::operator<<((ostream *)local_4d8,
                                 "SetCTestConfiguration from ENV{CMAKE_TLS_VERSION}:TLSVersion:");
        pbVar6 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_338);
        poVar7 = std::operator<<(poVar7,(string *)pbVar6);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
        std::__cxx11::ostringstream::str();
        pcVar11 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitCommand.cxx"
                     ,0x4b,pcVar11,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
        std::__cxx11::string::~string(local_4f8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d8);
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
        pbVar6 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_338);
        cmCTest::SetCTestConfiguration
                  (pcVar2,"TLSVersion",pbVar6,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1))
        ;
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_338);
    }
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"CTEST_TLS_VERIFY",
             (allocator<char> *)((long)&tlsVerifyVar.Value + 7));
  bVar4 = cmCTest::SetCTestConfigurationFromCMakeVariable
                    (pcVar2,pcVar1,"TLSVerify",&local_518,
                     (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tlsVerifyVar.Value + 7));
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_548,"CMAKE_TLS_VERIFY",&local_549);
    local_528 = cmMakefile::GetDefinition(pcVar1,&local_548);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator(&local_549);
    bVar4 = cmValue::operator_cast_to_bool(&local_528);
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream(local_6c8);
      poVar7 = std::operator<<((ostream *)local_6c8,
                               "SetCTestConfiguration from CMAKE_TLS_VERIFY:TLSVerify:");
      psVar8 = cmValue::operator*[abi_cxx11_(&local_528);
      poVar7 = std::operator<<(poVar7,(string *)psVar8);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::ostringstream::str();
      pcVar11 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitCommand.cxx"
                   ,0x58,pcVar11,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
      std::__cxx11::string::~string(local_6e8);
      std::__cxx11::ostringstream::~ostringstream(local_6c8);
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      psVar8 = cmValue::operator*[abi_cxx11_(&local_528);
      cmCTest::SetCTestConfiguration
                (pcVar2,"TLSVerify",psVar8,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    }
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,"CTEST_CURL_OPTIONS",&local_709);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"CurlOptions",&local_708,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_730,"CTEST_SUBMIT_INACTIVITY_TIMEOUT",
             (allocator<char> *)((long)&notesFilesVariable.Value + 7));
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"SubmitInactivityTimeout",&local_730,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator((allocator<char> *)((long)&notesFilesVariable.Value + 7));
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_760,"CTEST_NOTES_FILES",
             (allocator<char> *)
             ((long)&notesFiles.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_740 = cmMakefile::GetDefinition(pcVar1,&local_760);
  std::__cxx11::string::~string((string *)&local_760);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&notesFiles.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar4 = cmValue::operator_cast_to_bool(&local_740);
  if (bVar4) {
    extraFilesVariable.Value = &local_7b0;
    psVar8 = cmValue::operator*[abi_cxx11_(&local_740);
    std::__cxx11::string::string((string *)&local_7b0,(string *)psVar8);
    local_790 = &local_7b0;
    local_788 = 1;
    init_00._M_len = 1;
    init_00._M_array = local_790;
    cmList::cmList((cmList *)local_780,init_00);
    local_c30 = (string *)&local_790;
    do {
      local_c30 = local_c30 + -1;
      std::__cxx11::string::~string((string *)local_c30);
    } while (local_c30 != &local_7b0);
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    pcVar9 = cmList::operator_cast_to_vector_((cmList *)local_780);
    cmCTest::GenerateNotesFile(pcVar2,pcVar9);
    cmList::~cmList((cmList *)local_780);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e0,"CTEST_EXTRA_SUBMIT_FILES",
             (allocator<char> *)
             ((long)&extraFiles.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_7c0 = cmMakefile::GetDefinition(pcVar1,&local_7e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&extraFiles.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar4 = cmValue::operator_cast_to_bool(&local_7c0);
  if (bVar4) {
    local_838 = &local_830;
    psVar8 = cmValue::operator*[abi_cxx11_(&local_7c0);
    std::__cxx11::string::string((string *)&local_830,(string *)psVar8);
    local_810 = &local_830;
    local_808 = 1;
    init._M_len = 1;
    init._M_array = local_810;
    cmList::cmList((cmList *)local_800,init);
    local_c98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_810;
    do {
      local_c98 = local_c98 + -1;
      std::__cxx11::string::~string((string *)local_c98);
    } while (local_c98 != &local_830);
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    pcVar9 = cmList::operator_cast_to_vector_((cmList *)local_800);
    bVar4 = cmCTest::SubmitExtraFiles(pcVar2,pcVar9);
    if (!bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_858,"problem submitting extra files.",
                 (allocator<char> *)((long)&handler + 7));
      cmCommand::SetError((cmCommand *)this,&local_858);
      std::__cxx11::string::~string((string *)&local_858);
      std::allocator<char>::~allocator((allocator<char> *)((long)&handler + 7));
      this_local = (cmCTestSubmitCommand *)0x0;
    }
    handler._0_4_ = (uint)!bVar4;
    cmList::~cmList((cmList *)local_800);
    if ((uint)handler != 0) {
      return (cmCTestGenericHandler *)this_local;
    }
  }
  local_868 = cmCTest::GetSubmitHandler
                        ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(local_868->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])();
  bVar4 = std::optional::operator_cast_to_bool((optional *)&this->Files);
  pcVar3 = local_868;
  if (bVar4) {
    local_898._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_898._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_898._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_898._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_898._M_t._M_impl._0_8_ = 0;
    local_898._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_898._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>::set
              (&local_898);
    cmCTestSubmitHandler::SelectParts(pcVar3,&local_898);
    std::set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>::~set
              (&local_898);
    pcVar3 = local_868;
    pvVar10 = &std::
               optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&this->Files)->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(pvVar10);
    pvVar10 = &std::
               optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&this->Files)->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    parts.End.Func.this =
         (cmCTestSubmitCommand *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(pvVar10);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_8c8,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )parts.End.Func.this);
    cmCTestSubmitHandler::SelectFiles(pcVar3,&local_8c8);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_8c8);
  }
  bVar4 = std::optional::operator_cast_to_bool((optional *)&this->Parts);
  if (bVar4) {
    range = std::
            optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator*(&this->Parts);
    local_908 = cmMakeRange<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          (range);
    local_910 = this;
    cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
    ::transform<cmCTestSubmitCommand::InitializeHandler()::__0>
              ((cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_CTest_cmCTestSubmitCommand_cxx:148:45)>_>
                *)local_8f8,&local_908,(anon_class_8_1_8991fb9c_for_Func)this);
    pcVar3 = local_868;
    local_950 = cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitCommand.cxx:148:45)>_>
                ::begin((cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_CTest_cmCTestSubmitCommand_cxx:148:45)>_>
                         *)local_8f8);
    local_960 = cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitCommand.cxx:148:45)>_>
                ::end((cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_CTest_cmCTestSubmitCommand_cxx:148:45)>_>
                       *)local_8f8);
    std::set<cmCTest::Part,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>>::
    set<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmCTestSubmitCommand::InitializeHandler()::__0>>
              ((set<cmCTest::Part,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>> *)
               &local_940,local_950,local_960);
    cmCTestSubmitHandler::SelectParts(pcVar3,&local_940);
    std::set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>::~set
              (&local_940);
  }
  bVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&(this->HttpHeaders).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
  if (!bVar4) {
    cmCTestSubmitHandler::SetHttpHeaders
              (local_868,
               &(this->HttpHeaders).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
  }
  pcVar3 = local_868;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,"RetryDelay",&local_981);
  cmCTestGenericHandler::SetOption
            (&pcVar3->super_cmCTestGenericHandler,&local_980,&this->RetryDelay);
  std::__cxx11::string::~string((string *)&local_980);
  std::allocator<char>::~allocator(&local_981);
  pcVar3 = local_868;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a8,"RetryCount",&local_9a9);
  cmCTestGenericHandler::SetOption
            (&pcVar3->super_cmCTestGenericHandler,&local_9a8,&this->RetryCount);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::allocator<char>::~allocator(&local_9a9);
  pcVar3 = local_868;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d0,"InternalTest",&local_9d1)
  ;
  pcVar11 = "OFF";
  if ((this->InternalTest & 1U) != 0) {
    pcVar11 = "ON";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f8,pcVar11,&local_9f9);
  cmCTestGenericHandler::SetOption(&pcVar3->super_cmCTestGenericHandler,&local_9d0,&local_9f8);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::allocator<char>::~allocator(&local_9f9);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::allocator<char>::~allocator(&local_9d1);
  cmCTestGenericHandler::SetQuiet
            (&local_868->super_cmCTestGenericHandler,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  pcVar3 = local_868;
  if ((this->CDashUpload & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a20,"CDashUploadFile",&local_a21);
    cmCTestGenericHandler::SetOption
              (&pcVar3->super_cmCTestGenericHandler,&local_a20,&this->CDashUploadFile);
    std::__cxx11::string::~string((string *)&local_a20);
    std::allocator<char>::~allocator(&local_a21);
    pcVar3 = local_868;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a48,"CDashUploadType",&local_a49);
    cmCTestGenericHandler::SetOption
              (&pcVar3->super_cmCTestGenericHandler,&local_a48,&this->CDashUploadType);
    std::__cxx11::string::~string((string *)&local_a48);
    std::allocator<char>::~allocator(&local_a49);
  }
  return &local_868->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestSubmitCommand::InitializeHandler()
{
  cmValue submitURL = !this->SubmitURL.empty()
    ? cmValue(this->SubmitURL)
    : this->Makefile->GetDefinition("CTEST_SUBMIT_URL");

  if (submitURL) {
    this->CTest->SetCTestConfiguration("SubmitURL", *submitURL, this->Quiet);
  } else {
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropMethod", "CTEST_DROP_METHOD", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSiteUser", "CTEST_DROP_SITE_USER", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSitePassword", "CTEST_DROP_SITE_PASSWORD",
      this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSite", "CTEST_DROP_SITE", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropLocation", "CTEST_DROP_LOCATION", this->Quiet);
  }

  if (!this->CTest->SetCTestConfigurationFromCMakeVariable(
        this->Makefile, "TLSVersion", "CTEST_TLS_VERSION", this->Quiet)) {
    if (cmValue tlsVersionVar =
          this->Makefile->GetDefinition("CMAKE_TLS_VERSION")) {
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "SetCTestConfiguration from CMAKE_TLS_VERSION:TLSVersion:"
          << *tlsVersionVar << std::endl,
        this->Quiet);
      this->CTest->SetCTestConfiguration("TLSVersion", *tlsVersionVar,
                                         this->Quiet);
    } else if (cm::optional<std::string> tlsVersionEnv =
                 cmSystemTools::GetEnvVar("CMAKE_TLS_VERSION")) {
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "SetCTestConfiguration from ENV{CMAKE_TLS_VERSION}:TLSVersion:"
          << *tlsVersionEnv << std::endl,
        this->Quiet);
      this->CTest->SetCTestConfiguration("TLSVersion", *tlsVersionEnv,
                                         this->Quiet);
    }
  }
  if (!this->CTest->SetCTestConfigurationFromCMakeVariable(
        this->Makefile, "TLSVerify", "CTEST_TLS_VERIFY", this->Quiet)) {
    if (cmValue tlsVerifyVar =
          this->Makefile->GetDefinition("CMAKE_TLS_VERIFY")) {
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "SetCTestConfiguration from CMAKE_TLS_VERIFY:TLSVerify:"
          << *tlsVerifyVar << std::endl,
        this->Quiet);
      this->CTest->SetCTestConfiguration("TLSVerify", *tlsVerifyVar,
                                         this->Quiet);
    }
  }
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CurlOptions", "CTEST_CURL_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "SubmitInactivityTimeout",
    "CTEST_SUBMIT_INACTIVITY_TIMEOUT", this->Quiet);

  cmValue notesFilesVariable =
    this->Makefile->GetDefinition("CTEST_NOTES_FILES");
  if (notesFilesVariable) {
    cmList notesFiles{ *notesFilesVariable };
    this->CTest->GenerateNotesFile(notesFiles);
  }

  cmValue extraFilesVariable =
    this->Makefile->GetDefinition("CTEST_EXTRA_SUBMIT_FILES");
  if (extraFilesVariable) {
    cmList extraFiles{ *extraFilesVariable };
    if (!this->CTest->SubmitExtraFiles(extraFiles)) {
      this->SetError("problem submitting extra files.");
      return nullptr;
    }
  }

  cmCTestSubmitHandler* handler = this->CTest->GetSubmitHandler();
  handler->Initialize();

  // If no FILES or PARTS given, *all* PARTS are submitted by default.
  //
  // If FILES are given, but not PARTS, only the FILES are submitted
  // and *no* PARTS are submitted.
  //  (This is why we select the empty "noParts" set in the
  //   if(this->Files) block below...)
  //
  // If PARTS are given, only the selected PARTS are submitted.
  //
  // If both PARTS and FILES are given, only the selected PARTS *and*
  // all the given FILES are submitted.

  // If given explicit FILES to submit, pass them to the handler.
  //
  if (this->Files) {
    // Intentionally select *no* PARTS. (Pass an empty set.) If PARTS
    // were also explicitly mentioned, they will be selected below...
    // But FILES with no PARTS mentioned should just submit the FILES
    // without any of the default parts.
    //
    handler->SelectParts(std::set<cmCTest::Part>());
    handler->SelectFiles(
      std::set<std::string>(this->Files->begin(), this->Files->end()));
  }

  // If a PARTS option was given, select only the named parts for submission.
  //
  if (this->Parts) {
    auto parts =
      cmMakeRange(*(this->Parts)).transform([this](std::string const& arg) {
        return this->CTest->GetPartFromName(arg);
      });
    handler->SelectParts(std::set<cmCTest::Part>(parts.begin(), parts.end()));
  }

  // Pass along any HTTPHEADER to the handler if this option was given.
  if (!this->HttpHeaders.empty()) {
    handler->SetHttpHeaders(this->HttpHeaders);
  }

  handler->SetOption("RetryDelay", this->RetryDelay);
  handler->SetOption("RetryCount", this->RetryCount);
  handler->SetOption("InternalTest", this->InternalTest ? "ON" : "OFF");

  handler->SetQuiet(this->Quiet);

  if (this->CDashUpload) {
    handler->SetOption("CDashUploadFile", this->CDashUploadFile);
    handler->SetOption("CDashUploadType", this->CDashUploadType);
  }
  return handler;
}